

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O2

void __thiscall
jbcoin::STParsedJSONArray::STParsedJSONArray(STParsedJSONArray *this,string *name,Value *json)

{
  undefined1 *puVar1;
  pointer_type pSVar2;
  optional<jbcoin::detail::STVar> arr;
  optional_base<jbcoin::detail::STVar> local_88;
  
  (this->array).super_type.m_initialized = false;
  puVar1 = &(this->error).field_0x8;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfe00;
  STParsedJSONDetail::parseArray
            ((optional<jbcoin::detail::STVar> *)&local_88,name,json,(SField *)sfGeneric,0,
             &this->error);
  if (local_88.m_initialized != false) {
    pSVar2 = boost::optional<jbcoin::detail::STVar>::operator->
                       ((optional<jbcoin::detail::STVar> *)&local_88);
    if ((((rval_reference_type)pSVar2->p_)->super_STBase)._vptr_STBase ==
        (_func_int **)&PTR__STArray_002f7fa8) {
      boost::optional_detail::optional_base<jbcoin::STArray>::assign
                ((optional_base<jbcoin::STArray> *)this,(rval_reference_type)pSVar2->p_);
      goto LAB_001dc394;
    }
  }
  boost::optional_detail::optional_base<jbcoin::STArray>::assign
            ((optional_base<jbcoin::STArray> *)this);
LAB_001dc394:
  boost::optional_detail::optional_base<jbcoin::detail::STVar>::~optional_base(&local_88);
  return;
}

Assistant:

STParsedJSONArray::STParsedJSONArray (
    std::string const& name,
    Json::Value const& json)
{
    using namespace STParsedJSONDetail;
    auto arr = parseArray (name, json, sfGeneric, 0, error);
    if (!arr)
        array = boost::none;
    else
    {
        auto p = dynamic_cast <STArray*> (&arr->get());
        if (p == nullptr)
            array = boost::none;
        else
            array = std::move (*p);
    }
}